

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

CborError jsonValueToCbor(CborEncoder *parent,QJsonValue *v)

{
  bool value;
  undefined4 uVar1;
  CborError CVar2;
  char *string;
  long in_FS_OFFSET;
  double __x;
  double dVar3;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QJsonValue::type();
  switch(uVar1) {
  default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      CVar2 = cbor_encode_null(parent);
      return CVar2;
    }
    goto LAB_0010cc32;
  case 1:
    value = (bool)QJsonValue::toBool(SUB81(v,0));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      CVar2 = cbor_encode_boolean(parent,value);
      return CVar2;
    }
    goto LAB_0010cc32;
  case 2:
    __x = (double)QJsonValue::toDouble(0.0);
    dVar3 = floor(__x);
    if (((__x != dVar3) || (NAN(__x) || NAN(dVar3))) || (9007199254740992.0 < ABS(__x))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        CVar2 = cbor_encode_double(parent,__x);
        return CVar2;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      CVar2 = cbor_encode_int(parent,(long)__x);
      return CVar2;
    }
    goto LAB_0010cc32;
  case 3:
    local_48.size = 0xaaaaaaaaaaaaaaaa;
    local_48.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_48.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    QJsonValue::toString();
    QString::toUtf8_helper((QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    string = local_48.ptr;
    if (local_48.ptr == (char *)0x0) {
      string = (char *)&QByteArray::_empty;
    }
    cbor_encode_text_string(parent,string,local_48.size);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
    break;
  case 4:
    QJsonValue::toArray();
    jsonArrayToCbor(parent,(QJsonArray *)&local_48);
    QJsonArray::~QJsonArray((QJsonArray *)&local_48);
    break;
  case 5:
    QJsonValue::toObject();
    jsonObjectToCbor(parent,(QJsonObject *)&local_48);
    QJsonObject::~QJsonObject((QJsonObject *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (CborError)*(long *)(in_FS_OFFSET + 0x28);
  }
LAB_0010cc32:
  __stack_chk_fail();
}

Assistant:

static CborError jsonValueToCbor(CborEncoder *parent, const QJsonValue &v)
{
    switch (v.type()) {
    case QJsonValue::Null:
    case QJsonValue::Undefined:
        return cbor_encode_null(parent);
    case QJsonValue::Bool:
        return cbor_encode_boolean(parent, v.toBool());
    case QJsonValue::Array:
        return jsonArrayToCbor(parent, v.toArray());
    case QJsonValue::Object:
        return jsonObjectToCbor(parent, v.toObject());
    case QJsonValue::String: {
        QByteArray s = v.toString().toUtf8();
        return cbor_encode_text_string(parent, s.constData(), s.size());
    }
    case QJsonValue::Double: {
        double d = v.toDouble();
        if (d == floor(d) && fabs(d) <= (Q_INT64_C(1) << std::numeric_limits<double>::digits))
            return cbor_encode_int(parent, qint64(d));
        return cbor_encode_double(parent, d);
    }
    }
    Q_UNREACHABLE_RETURN(CborUnknownError);
}